

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O1

SRes crnlib::LzmaDecode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte *propData,
                       uint propSize,ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAlloc *alloc)

{
  ulong uVar1;
  SizeT dicLimit;
  SRes SVar2;
  SRes SVar3;
  CLzmaDec CStack_b8;
  
  uVar1 = *srcLen;
  dicLimit = *destLen;
  *destLen = 0;
  *srcLen = 0;
  SVar2 = 6;
  if (4 < uVar1) {
    CStack_b8.probs = (UInt16 *)0x0;
    CStack_b8.dic = (Byte *)0x0;
    SVar2 = LzmaDec_AllocateProbs(&CStack_b8,propData,propSize,alloc);
    if (SVar2 == 0) {
      CStack_b8.dicPos = 0;
      CStack_b8.remainLen = 0;
      CStack_b8.needFlush = 1;
      CStack_b8.tempBufSize = 0;
      CStack_b8.processedPos = 0;
      CStack_b8.checkDicSize = 0;
      CStack_b8.needInitState = 1;
      *srcLen = uVar1;
      CStack_b8.dic = dest;
      CStack_b8.dicBufSize = dicLimit;
      SVar3 = LzmaDec_DecodeToDic(&CStack_b8,dicLimit,src,srcLen,finishMode,status);
      SVar2 = 1;
      if ((SVar3 == 0) && (SVar2 = 0, *status == LZMA_STATUS_NEEDS_MORE_INPUT)) {
        SVar2 = 6;
      }
      *destLen = CStack_b8.dicPos;
      (*alloc->Free)(alloc,CStack_b8.probs);
    }
  }
  return SVar2;
}

Assistant:

SRes LzmaDecode(Byte* dest, SizeT* destLen, const Byte* src, SizeT* srcLen,
                const Byte* propData, unsigned propSize, ELzmaFinishMode finishMode,
                ELzmaStatus* status, ISzAlloc* alloc) {
  CLzmaDec p;
  SRes res;
  SizeT inSize = *srcLen;
  SizeT outSize = *destLen;
  *srcLen = *destLen = 0;
  if (inSize < RC_INIT_SIZE)
    return SZ_ERROR_INPUT_EOF;

  LzmaDec_Construct(&p);
  res = LzmaDec_AllocateProbs(&p, propData, propSize, alloc);
  if (res != 0)
    return res;
  p.dic = dest;
  p.dicBufSize = outSize;

  LzmaDec_Init(&p);

  *srcLen = inSize;
  res = LzmaDec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);

  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;

  (*destLen) = p.dicPos;
  LzmaDec_FreeProbs(&p, alloc);
  return res;
}